

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_context_strand.hpp
# Opt level: O0

void __thiscall
asio::io_context::strand::initiate_post::operator()
          (initiate_post *this,anon_class_48_2_3c81cf3a_for_handler_ *handler,strand *self)

{
  non_const_lvalue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:70:32)>
  local_28;
  non_const_lvalue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:70:32)>
  handler2;
  strand *self_local;
  anon_class_48_2_3c81cf3a_for_handler_ *handler_local;
  initiate_post *this_local;
  
  handler2.value = (type)self;
  detail::
  non_const_lvalue<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/continental[P]fineftp-server/fineftp-server/src/ftp_session.cpp:70:32)>
  ::non_const_lvalue(&local_28,handler);
  detail::strand_service::
  post<fineftp::FtpSession::sendRawFtpMessage(std::__cxx11::string_const&)::__0>
            ((strand_service *)
             ((handler2.value)->me).
             super___shared_ptr<fineftp::FtpSession,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (implementation_type *)
             &((handler2.value)->me).
              super___shared_ptr<fineftp::FtpSession,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             local_28.value);
  return;
}

Assistant:

void operator()(ASIO_MOVE_ARG(LegacyCompletionHandler) handler,
        strand* self) const
    {
      // If you get an error on the following line it means that your
      // handler does not meet the documented type requirements for a
      // LegacyCompletionHandler.
      ASIO_LEGACY_COMPLETION_HANDLER_CHECK(
          LegacyCompletionHandler, handler) type_check;

      detail::non_const_lvalue<LegacyCompletionHandler> handler2(handler);
      self->service_.post(self->impl_, handler2.value);
    }